

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O3

bool __thiscall SceneRender::loadScene(SceneRender *this,Uniforms *_uniforms)

{
  _Rb_tree_header *p_Var1;
  Model *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  _Base_ptr p_Var5;
  mapped_type *ppLVar6;
  DefaultShaders extraout_EDX;
  DefaultShaders extraout_EDX_00;
  DefaultShaders extraout_EDX_01;
  DefaultShaders DVar7;
  DefaultShaders _type;
  DefaultShaders extraout_EDX_02;
  DefaultShaders extraout_EDX_03;
  DefaultShaders extraout_EDX_04;
  DefaultShaders _type_00;
  float fVar8;
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined1 auVar14 [16];
  string local_90;
  string local_70;
  float local_50;
  float local_4c;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  vera::cleanLabels();
  p_Var5 = (_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    local_48 = ZEXT816(0x7f7fffff7f7fffff);
    local_50 = 1.1754944e-38;
    local_4c = 3.4028235e+38;
    uVar13 = 0x80000000800000;
  }
  else {
    local_48 = ZEXT816(0x7f7fffff7f7fffff);
    local_38._0_8_ = 0x80000000800000;
    local_38._8_8_ = 0;
    local_4c = 3.4028235e+38;
    local_50 = 1.1754944e-38;
    do {
      vera::addLabel(&(*(Model **)(p_Var5 + 2))->m_name,*(Model **)(p_Var5 + 2),LABEL_RIGHT,0.0);
      lVar4 = *(long *)(p_Var5 + 2);
      fVar10 = *(float *)(lVar4 + 0x29c);
      fVar8 = fVar10;
      if (local_4c <= fVar10) {
        fVar8 = local_4c;
      }
      if (fVar10 <= local_50) {
        fVar10 = local_50;
      }
      local_50 = *(float *)(lVar4 + 0x2a8);
      local_4c = local_50;
      if (fVar8 <= local_50) {
        local_4c = fVar8;
      }
      if (local_50 <= fVar10) {
        local_50 = fVar10;
      }
      auVar11._0_8_ = CONCAT44(*(undefined4 *)(lVar4 + 0x2a0),*(undefined4 *)(lVar4 + 0x298));
      auVar11._8_8_ = 0;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = auVar11._0_8_;
      auVar9 = minps(auVar9,local_48);
      auVar14._0_8_ = CONCAT44(*(undefined4 *)(lVar4 + 0x2ac),*(undefined4 *)(lVar4 + 0x2a4));
      auVar14._8_8_ = 0;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = auVar14._0_8_;
      local_48 = minps(auVar12,auVar9);
      auVar9 = maxps(auVar11,local_38);
      local_38 = maxps(auVar14,auVar9);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      uVar13 = local_38._0_8_;
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  fVar8 = SQRT((float)local_48._4_4_ * (float)local_48._4_4_ +
               local_4c * local_4c + (float)local_48._0_4_ * (float)local_48._0_4_);
  fVar10 = (float)((ulong)uVar13 >> 0x20);
  fVar10 = SQRT(fVar10 * fVar10 + local_50 * local_50 + (float)uVar13 * (float)uVar13);
  if (fVar10 <= fVar8) {
    fVar10 = fVar8;
  }
  if (fVar10 <= 0.5) {
    fVar10 = 0.5;
  }
  this->m_area = fVar10;
  this->m_floor_height = local_4c;
  paVar2 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"FLOOR","");
  paVar3 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  this_00 = &this->m_floor;
  vera::Model::addDefine(this_00,&local_70,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"MODEL_VERTEX_COLOR","");
  local_90._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"v_color","");
  vera::Model::addDefine(this_00,&local_70,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"MODEL_VERTEX_NORMAL","");
  local_90._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"v_normal","");
  vera::Model::addDefine(this_00,&local_70,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"MODEL_VERTEX_TEXCOORD","");
  local_90._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"v_texcoord","");
  vera::Model::addDefine(this_00,&local_70,&local_90);
  DVar7 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    DVar7 = extraout_EDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    DVar7 = extraout_EDX_01;
  }
  vera::getDefaultSrc_abi_cxx11_(&local_70,(vera *)0x9,DVar7);
  vera::getDefaultSrc_abi_cxx11_(&local_90,(vera *)0x8,_type);
  vera::Shader::setSource(&this->m_cubemap_shader,&local_70,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"u_light","");
  local_90._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"default","");
  ppLVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
            ::operator[](&(_uniforms->super_Scene).lights,&local_90);
  vera::addLabel(&local_70,&(*ppLVar6)->super_Node,LABEL_DOWN,30.0);
  DVar7 = extraout_EDX_02;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    DVar7 = extraout_EDX_03;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    DVar7 = extraout_EDX_04;
  }
  vera::getDefaultSrc_abi_cxx11_(&local_70,(vera *)0xd,DVar7);
  vera::getDefaultSrc_abi_cxx11_(&local_90,(vera *)0xc,_type_00);
  vera::Shader::setSource(&this->m_lightUI_shader,&local_70,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool SceneRender::loadScene(Uniforms& _uniforms) {
    vera::cleanLabels();

    // Calculate the total area
    vera::BoundingBox bbox;
    for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it) {
        vera::addLabel( it->second->getName(), it->second, vera::LABEL_RIGHT);
        bbox.expand( it->second->getBoundingBox() );
    }

    m_area = glm::max(0.5f, glm::max(glm::length(bbox.min), glm::length(bbox.max)));
    
    // Floor
    m_floor_height = bbox.min.y;
    m_floor.addDefine("FLOOR");
    m_floor.addDefine("MODEL_VERTEX_COLOR", "v_color");
    m_floor.addDefine("MODEL_VERTEX_NORMAL", "v_normal");
    m_floor.addDefine("MODEL_VERTEX_TEXCOORD","v_texcoord");
    // m_floor.setShader(vera::getDefaultSrc(vera::FRAG_DEFAULT_SCENE), vera::getDefaultSrc(vera::VERT_DEFAULT_SCENE));

    // Cubemap
    m_cubemap_shader.setSource(vera::getDefaultSrc(vera::FRAG_CUBEMAP), vera::getDefaultSrc(vera::VERT_CUBEMAP));

    // Light
    vera::addLabel("u_light", _uniforms.lights["default"], vera::LABEL_DOWN, 30.0f);
    m_lightUI_shader.setSource(vera::getDefaultSrc(vera::FRAG_LIGHT), vera::getDefaultSrc(vera::VERT_LIGHT));

    return true;
}